

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,REF_INT *tet_nodes,REF_BOOL *contains)

{
  undefined1 auVar1 [16];
  int iVar2;
  REF_STATUS RVar3;
  long lVar4;
  int iVar5;
  
  *contains = 0;
  auVar1 = *(undefined1 (*) [16])tet_nodes;
  lVar4 = 0;
  iVar5 = 0;
  do {
    iVar2 = pri_nodes[lVar4];
    iVar5 = (uint)(iVar2 == auVar1._12_4_) + (uint)(iVar2 == auVar1._4_4_) +
            (uint)(iVar2 == auVar1._8_4_) + iVar5 + (uint)(iVar2 == auVar1._0_4_);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  if (iVar5 < 5) {
    RVar3 = 0;
    if (iVar5 == 4) {
      *contains = 1;
      RVar3 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2e2,
           "ref_layer_tet_prism","repeated tet nodes in prism");
    printf("hits %d\n",iVar5);
    RVar3 = 1;
  }
  return RVar3;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_prism(REF_INT *pri_nodes,
                                              REF_INT *tet_nodes,
                                              REF_BOOL *contains) {
  REF_INT hits, tet_node, pri_node;
  *contains = REF_FALSE;
  hits = 0;
  for (pri_node = 0; pri_node < 6; pri_node++) {
    for (tet_node = 0; tet_node < 4; tet_node++) {
      if (pri_nodes[pri_node] == tet_nodes[tet_node]) {
        hits++;
      }
    }
  }
  RAB(hits <= 4, "repeated tet nodes in prism", { printf("hits %d\n", hits); });
  if (4 == hits) *contains = REF_TRUE;
  return REF_SUCCESS;
}